

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O0

void Cnf_ManTransferCuts(Cnf_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Cnf_Cut_t *pCVar2;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Man_t *p_local;
  
  Aig_MmFlexRestart(p->pMemCuts);
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->pManAig->vObjs), local_1c < iVar1;
      local_1c = local_1c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->pManAig->vObjs,local_1c);
    if (pObj_00 != (Aig_Obj_t *)0x0) {
      iVar1 = Aig_ObjIsNode(pObj_00);
      if ((iVar1 == 0) || ((*(ulong *)&pObj_00->field_0x18 >> 6 & 0x3ffffff) == 0)) {
        (pObj_00->field_5).pData = (void *)0x0;
      }
      else {
        pCVar2 = Cnf_CutCreate(p,pObj_00);
        (pObj_00->field_5).pData = pCVar2;
      }
    }
  }
  return;
}

Assistant:

void Cnf_ManTransferCuts( Cnf_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_MmFlexRestart( p->pMemCuts );
    Aig_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) && pObj->nRefs > 0 )
            pObj->pData = Cnf_CutCreate( p, pObj );
        else
            pObj->pData = NULL;
    }
}